

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

lyd_node * moveto_axis_node_next_dfs_backward(lyd_node *iter,lyd_node *stop)

{
  long lVar1;
  lyd_node *plVar2;
  
  plVar2 = iter->prev;
  if (plVar2 != (lyd_node *)0x0 && plVar2->next != (lyd_node *)0x0) {
    do {
      if ((plVar2->schema != (lysc_node *)0x0) && ((plVar2->schema->nodetype & 0x711) == 0)) {
        return plVar2;
      }
      lVar1._0_4_ = plVar2[1].hash;
      lVar1._4_4_ = plVar2[1].flags;
      if (lVar1 == 0) {
        return plVar2;
      }
      plVar2 = *(lyd_node **)(*(long *)(plVar2 + 1) + 0x20);
    } while (plVar2 != (lyd_node *)0x0);
  }
  if (iter != (lyd_node *)0x0) {
    return (lyd_node *)iter->parent;
  }
  return (lyd_node *)0x0;
}

Assistant:

static const struct lyd_node *
moveto_axis_node_next_dfs_backward(const struct lyd_node *iter, const struct lyd_node *stop)
{
    const struct lyd_node *next = NULL;

    /* 1) previous sibling innermost last child */
    next = iter->prev->next ? iter->prev : NULL;
    while (next && lyd_child(next)) {
        next = lyd_child(next);
        next = next->prev;
    }

    if (!next) {
        /* 2) parent */
        iter = lyd_parent(iter);
        if ((!stop && !iter) || (stop && (lyd_parent(iter) == lyd_parent(stop)))) {
            return NULL;
        }
        next = iter;
    }

    return next;
}